

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_GetDefaultByType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  PClass *pPVar3;
  BYTE *val;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0043434e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0043433e:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043434e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dd2,
                  "int AF_AActor_GetDefaultByType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pPVar1 = (PClass *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pPVar1 != (PClass *)0x0) {
      pPVar3 = pPVar1;
      if (pPVar1 != AActor::RegistrationInfo.MyClass) {
        do {
          pPVar3 = pPVar3->ParentClass;
          if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
        } while (pPVar3 != (PClass *)0x0);
        if (pPVar3 == (PClass *)0x0) {
          __assertion = "cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043434e;
        }
      }
      val = pPVar1->Defaults;
      goto LAB_0043431a;
    }
  }
  else if (pPVar1 != (PClass *)0x0) goto LAB_0043433e;
  val = (BYTE *)0x0;
LAB_0043431a:
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1dd3,
                    "int AF_AActor_GetDefaultByType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = 1;
    VMReturn::SetPointer(ret,val,1);
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDefaultByType)
{
	PARAM_PROLOGUE;
	PARAM_CLASS(cls, AActor);
	ACTION_RETURN_OBJECT(cls == nullptr? nullptr : GetDefaultByType(cls));
}